

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.c
# Opt level: O0

void path2dirname(char *path,char *dir)

{
  bool bVar1;
  size_t l;
  size_t i;
  char *dir_local;
  char *path_local;
  
  l = strlen(path);
  do {
    l = l - 1;
    bVar1 = false;
    if (l != 0) {
      bVar1 = path[l] != '/';
    }
  } while (bVar1);
  if (l == 0) {
    *dir = '.';
    dir[1] = '\0';
  }
  else {
    memcpy(dir,path,l);
    dir[l] = '\0';
  }
  return;
}

Assistant:

void
path2dirname(const char *path, char *dir)
{
    size_t i, l;

    l = strlen(path);
#if defined(_WIN32) || defined(__CYGWIN__)
    for (i = l - 1; (i > 0) && !(path[i] == '/' || path[i] == '\\'); --i);
#else
    for (i = l - 1; (i > 0) && !(path[i] == '/'); --i);
#endif
    if (i == 0) {
        dir[0] = '.';
        dir[1] = '\0';
    } else {
        memcpy(dir, path, i);
        dir[i] = '\0';
    }
}